

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O2

int scaling_list_data(HEVCContext *s,ScalingList *sl,HEVCSPS *sps)

{
  byte bVar1;
  RK_U8 RVar2;
  undefined2 uVar3;
  BitReadCtx_t *bitctx;
  uint uVar4;
  MPP_RET MVar5;
  RK_U8 *pRVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  RK_S32 _out;
  ScalingList *local_80;
  RK_U8 (*local_78) [6];
  ulong local_70;
  HEVCSPS *local_68;
  RK_U8 (*local_60) [6];
  RK_U8 (*local_58) [6] [64];
  size_t local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  bitctx = &s->HEVClc->gb;
  local_60 = sl->sl_dc;
  uVar10 = 0;
  local_80 = sl;
  local_68 = sps;
  do {
    if (uVar10 == 4) {
      if (local_68->chroma_format_idc == 3) {
        for (lVar7 = -0x40; lVar7 != 0; lVar7 = lVar7 + 1) {
          RVar2 = local_80->sl[2][3][lVar7];
          local_80->sl[3][2][lVar7] = local_80->sl[2][2][lVar7];
          local_80->sl[3][3][lVar7] = RVar2;
          *(RK_U8 *)((long)(local_80->sl_dc + -0xb) + lVar7 + 2) = local_80->sl[2][5][lVar7];
          local_80->sl_dc[0][lVar7] = local_80->sl[3][0][lVar7];
        }
        uVar3 = *(undefined2 *)(local_80->sl_dc[0] + 4);
        *(undefined2 *)(local_80->sl_dc[1] + 1) = *(undefined2 *)(local_80->sl_dc[0] + 1);
        *(undefined2 *)(local_80->sl_dc[1] + 4) = uVar3;
      }
      return 0;
    }
    uVar4 = 0x10 << ((char)uVar10 * '\x02' & 0x1fU);
    local_38 = (ulong)uVar4;
    if (0x3f < uVar4) {
      local_38 = 0x40;
    }
    local_70 = (ulong)((uint)(uVar10 == 3) * 2 + 1);
    local_50 = 0x40;
    if (uVar10 == 0) {
      local_50 = 0x10;
    }
    local_48 = uVar10 * 0x180;
    local_58 = local_80->sl + uVar10;
    local_78 = local_60 + (uVar10 - 2);
    local_40 = uVar10;
    for (uVar8 = 0; uVar8 < 6; uVar8 = uVar8 + local_70) {
      MVar5 = mpp_read_bits(bitctx,1,&_out);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return -0x3ec;
      }
      if ((char)_out == '\0') {
        MVar5 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
        bitctx->ret = MVar5;
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        if (_out != 0) {
          if (uVar8 < (uint)(_out * (int)local_70)) {
            _mpp_log_l(2,"H265PARSER_PS","Invalid delta in scaling list data: %d.\n",(char *)0x0);
            return -0x3ec;
          }
          uVar4 = (int)uVar8 - _out * (int)local_70;
          memcpy(*local_58 + uVar8,*local_58 + uVar4,local_50);
          if (1 < uVar10) {
            (*local_78)[uVar8] = (*local_78)[uVar4];
          }
        }
      }
      else {
        uVar9 = 8;
        if (1 < uVar10) {
          MVar5 = mpp_read_se(bitctx,&_out);
          bitctx->ret = MVar5;
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          uVar9 = (ulong)(_out + 8U);
          (*local_78)[uVar8] = (RK_U8)(_out + 8U);
        }
        for (uVar11 = 0; local_38 != uVar11; uVar11 = uVar11 + 1) {
          if (uVar10 == 0) {
            lVar7 = (ulong)""[uVar11] << 2;
            pRVar6 = "";
          }
          else {
            lVar7 = (ulong)""[uVar11] << 3;
            pRVar6 = "";
          }
          bVar1 = pRVar6[uVar11];
          MVar5 = mpp_read_se(bitctx,&_out);
          bitctx->ret = MVar5;
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          uVar9 = (long)((int)uVar9 + _out + 0x100) % 0x100 & 0xffffffff;
          local_80->sl[0][uVar8][lVar7 + (ulong)bVar1 + local_48] = (RK_U8)uVar9;
          uVar10 = local_40;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static int scaling_list_data(HEVCContext *s, ScalingList *sl, HEVCSPS *sps)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_U8 scaling_list_pred_mode_flag;
    RK_S32 scaling_list_dc_coef[2][6];
    RK_S32 size_id,  i, pos;
    RK_U32 matrix_id;

    for (size_id = 0; size_id < 4; size_id++)
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1)) {
            READ_ONEBIT(gb, &scaling_list_pred_mode_flag);
            if (!scaling_list_pred_mode_flag) {
                RK_U32 delta = 0;
                READ_UE(gb, &delta);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta) {
                    // Copy from previous array.
                    delta *= (size_id == 3) ? 3 : 1;
                    if (matrix_id < delta) {
                        mpp_err(
                            "Invalid delta in scaling list data: %d.\n", delta);
                        return  MPP_ERR_STREAM;
                    }

                    memcpy(sl->sl[size_id][matrix_id],
                           sl->sl[size_id][matrix_id - delta],
                           size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            } else {
                RK_S32 next_coef, coef_num;
                RK_S32 scaling_list_delta_coef;

                next_coef = 8;
                coef_num  = MPP_MIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1) {
                    READ_SE(gb, &scaling_list_dc_coef[size_id - 2][matrix_id]);
                    scaling_list_dc_coef[size_id - 2][matrix_id] =  scaling_list_dc_coef[size_id - 2][matrix_id] + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = next_coef;
                }
                for (i = 0; i < coef_num; i++) {
                    if (size_id == 0)
                        pos = 4 * mpp_hevc_diag_scan4x4_y[i] +
                              mpp_hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * mpp_hevc_diag_scan8x8_y[i] +
                              mpp_hevc_diag_scan8x8_x[i];

                    READ_SE(gb, &scaling_list_delta_coef);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = next_coef;
                }
            }
        }
    if (sps->chroma_format_idc == H265_CHROMA_444) {
        for (i = 0; i < 64; i++) {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}